

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O0

void whileloop(Item *qsol,long type,int ss)

{
  int iVar1;
  int in_EDX;
  List *in_RSI;
  double dVar2;
  char sval [30];
  Item *q;
  int i;
  double d [3];
  char *cp;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  Item *local_48;
  int local_3c;
  double local_38 [3];
  char *local_20;
  int local_14;
  List *local_10;
  
  local_20 = (char *)0x0;
  if ((in_RSI != (List *)0x10f) && (in_RSI != (List *)0x200)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/solve.c"
                  ,0x1cc,"void whileloop()");
  }
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (whileloop::firstderf != 0) {
    sprintf(buf,"delta_%s",indepsym->name);
    local_3c = 0;
    local_48 = indeplist->next;
    for (; local_3c < 3; local_3c = local_3c + 1) {
      dVar2 = atof((local_48->element).str);
      local_38[local_3c] = dVar2;
      local_48 = local_48->next;
    }
    if (local_10 == (List *)0x200) {
      sprintf(&stack0xffffffffffffff98,"%g",(local_38[1] - local_38[0]) / local_38[2]);
    }
    else if (local_10 == (List *)0x10f) {
      sprintf(&stack0xffffffffffffff98,"1.0");
    }
    deltaindep = ifnew_parminstall(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                   (char *)in_RSI,in_stack_ffffffffffffff88);
    whileloop::firstderf = 0;
  }
  if (local_10 == (List *)0x200) {
    local_20 = "dt";
  }
  else if (local_10 == (List *)0x10f) {
    local_20 = "0.0";
  }
  if (local_14 == 0) {
    iVar1 = strcmp(indepsym->name,"t");
    if (iVar1 != 0) {
      diag((char *)in_RSI,in_stack_ffffffffffffff88);
    }
    if (whileloop::called != 0) {
      fprintf(_stderr,
              "Warning: More than one integrating SOLVE statement in an BREAKPOINT block.\nThe simulation will be incorrect if more than one is used at a time.\n"
             );
    }
    if (whileloop::called == 0) {
      sprintf(buf," _save = %s;\n %s = 0.0;\n",indepsym->name,indepsym->name);
      saveindep = stralloc((char *)in_RSI,in_stack_ffffffffffffff88);
      sprintf(buf," _sav_indep = %s; %s = _save;\n",indepsym->name,indepsym->name);
      lappendstr(in_RSI,in_stack_ffffffffffffff88);
      vectorize_substitute(in_RSI,in_stack_ffffffffffffff88);
    }
    whileloop::called = whileloop::called + 1;
  }
  return;
}

Assistant:

static void whileloop(qsol, type, ss)
	Item *qsol;
	long type;
	int ss;
{
/* no solve statement except this is allowed to
change the indepvar. Time passed to integrators
must therefore be saved and restored. */
/* Note that when the user changes the independent variable within Scop,
the while loop still uses the original independent variable. In this case
1) _break must be set to the entry value of the original independent variable
2) initmodel() must be called after each entry to model()
3) in initmodel() we are very careful not to destroy the entry value of
   time-- on exit it has its original value.  Note that _sav_indep gets
   any value of time that is set within initmodel().
*/
/* executing more that one for loop in a single call to model() is an error
which is trapped in scop */
	static int called = 0, firstderf = 1;
	char *cp=0;

	switch (type) {
	case DERF:
	case DISCRETE:
		if (firstderf) { /* time dependent process so create a deltastep */
			double d[3];
#ifndef NeXT			
			double atof();
#endif
			int i;
			Item *q;
			char sval[30];
			Sprintf(buf, "delta_%s", indepsym->name);
			for (i=0, q=indeplist->next; i<3; i++, q=q->next) {
				d[i] = atof(STR(q));
			}
			if (type == DERF) {
				Sprintf(sval, "%g", (d[1]-d[0])/d[2]);
			}else if (type == DISCRETE) {
				Sprintf(sval, "1.0");
			}
			deltaindep = ifnew_parminstall(buf, sval, "", "");
			firstderf = 0;
#if NMODL
#else
Sprintf(buf, "_modl_set_dt(_dt) double _dt; { %s = _dt;}\n",
		deltaindep->name);
			Lappendstr(procfunc, buf);
#endif
		}
		if (type == DERF) {
			cp = "dt";
		}else if (type == DISCRETE) {
			cp = "0.0";
		}
		if (ss) {
			return;
		}
		break;
	default:
		/*SUPPRESS 622*/
		assert(0);
	}
#if NMODL
	if (strcmp(indepsym->name, "t") != 0) {
		diag("The independent variable name must be `t'", (char *)0);
	}
#else
	Sprintf(buf, "_save = _break = %s; %s = _sav_indep;\n",
		indepsym->name, indepsym->name);
	Insertstr(qsol, buf);
#if !SIMSYS
	Sprintf(buf, "if (_p + _indepindex != &%s) {initmodel(_pp); %s = _sav_indep;}\n",
		indepsym->name, indepsym->name);
	Insertstr(qsol, buf);
#endif
#endif

	if (called) {
Fprintf(stderr, "Warning: More than one integrating SOLVE statement in an \
BREAKPOINT block.\nThe simulation will be incorrect if more than one is used \
at a time.\n");
	}
#if NMODL
#else
	Sprintf(buf, "if (%s < _break) {\n",indepsym->name);
	Insertstr(qsol, buf);

/* ensure that there are an integer number of steps / break */
if (type == DERF) {
	Sprintf(buf, " { int _nstep; double _dt, _y;\n\
	_y = _break - %s; _dt = %s;\n", indepsym->name, "dt");
 	Insertstr(qsol, buf);
 	Insertstr(qsol, "_nstep = (int)(_y/_dt + .9);\n if (_nstep==0) _nstep = 1;\n");
 	Sprintf(buf, "%s = _y/((double)_nstep);\n", "dt");
 	Insertstr(qsol, buf);
	Sprintf(buf, "\n  }\n");
	Insertstr(qsol, buf);
}
 
	if (type == DERF) {
		Sprintf(buf, "_break -= .5* %s;\n", "dt");
		Insertstr(qsol, buf);
	}
#endif
#if NMODL
	/* no longer a for loop */
#else
	Sprintf(buf, "for (; %s < _break; %s += %s) {\n",
		indepsym->name,
		indepsym->name, cp);
	Insertstr(qsol, buf);
	/* close the while loop; note that integrators have been called */
	if (type == DERF) {
		Sprintf(buf, "\n}}\n %s = _save;\n", indepsym->name);
	}else if (type == DISCRETE) {
		Sprintf(buf, "\n}}\n");
	}		
	Insertstr(qsol->next,buf);
#endif
	if (!called) {
		/* fix up initmodel as per 3) above.
		In cout.c _save is declared */
#if NMODL
		Sprintf(buf, " _save = %s;\n %s = 0.0;\n",
			indepsym->name, indepsym->name);
		saveindep = stralloc(buf, (char *)0);
#else
		Sprintf(buf, "%s0", indepsym->name);
		IGNORE(ifnew_parminstall(buf, STR(indeplist->prev->prev),
			STR(indeplist->prev), ""));
		Sprintf(buf, " _save = %s;\n %s = %s0;\n",
			indepsym->name, indepsym->name, indepsym->name);
		saveindep = stralloc(buf, (char *)0);
#endif
		/* Assert no more additions to initfunc involving
		the value of time */
		Sprintf(buf, " _sav_indep = %s; %s = _save;\n",
			indepsym->name, indepsym->name);
		Lappendstr(initfunc, buf);
#if VECTORIZE
		vectorize_substitute(initfunc->prev, "");
#endif
	}
	called++;
}